

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

int Abc_NtkIvyProve(Abc_Ntk_t **ppNtk,void *pPars)

{
  DdNode *pDVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  int *piVar6;
  Aig_Man_t *pAVar7;
  DdNode *pDVar8;
  bool local_cd;
  char local_c8 [8];
  char pFileName [100];
  uint local_5c;
  int RetValue;
  Aig_Man_t *pMan2;
  Ivy_Man_t *pMan;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkTemp;
  Abc_Ntk_t *pNtk;
  Prove_Params_t *pParams;
  void *pPars_local;
  Abc_Ntk_t **ppNtk_local;
  
  pNtkTemp = *ppNtk;
  pNtk = (Abc_Ntk_t *)pPars;
  pParams = (Prove_Params_t *)pPars;
  pPars_local = ppNtk;
  iVar2 = Abc_NtkIsStrash(pNtkTemp);
  if ((iVar2 == 0) && (iVar2 = Abc_NtkIsLogic(pNtkTemp), iVar2 == 0)) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                  ,0x1fe,"int Abc_NtkIvyProve(Abc_Ntk_t **, void *)");
  }
  iVar2 = Abc_NtkIsStrash(pNtkTemp);
  if (iVar2 == 0) {
    pObj = (Abc_Obj_t *)pNtkTemp;
    pNtkTemp = Abc_NtkStrash(pNtkTemp,0,1,0);
    Abc_NtkDelete((Abc_Ntk_t *)pObj);
  }
  pFanin = Abc_NtkPo(pNtkTemp,0);
  pMan = (Ivy_Man_t *)Abc_ObjFanin0(pFanin);
  pAVar5 = Abc_ObjFanin0(pFanin);
  uVar4 = *(uint *)&pAVar5->field_0x14;
  uVar3 = Abc_ObjFaninC0(pFanin);
  if ((uVar4 >> 7 & 1) == uVar3) {
    pAVar7 = Abc_NtkToDar(pNtkTemp,0,0);
    uVar4 = Fra_FraigSat(pAVar7,(long)*(int *)((long)&pNtk->pSpec + 4),0,0,0,0,1,0,0,0);
    pNtkTemp->pModel = (int *)pAVar7->pData;
    pAVar7->pData = (void *)0x0;
    Aig_ManStop(pAVar7);
    ppNtk_local._4_4_ = uVar4;
    if ((int)uVar4 < 0) {
      if ((pNtk->ntkFunc != ABC_FUNC_NONE) && (iVar2 = Abc_NtkNodeNum(pNtkTemp), 500 < iVar2)) {
        pNtk->ntkFunc = ABC_FUNC_NONE;
        pObj = (Abc_Obj_t *)pNtkTemp;
        pNtkTemp = Abc_NtkBalance(pNtkTemp,0,0,0);
        Abc_NtkDelete((Abc_Ntk_t *)pObj);
        Abc_NtkRewrite(pNtkTemp,0,0,0,0,0);
        pObj = (Abc_Obj_t *)pNtkTemp;
        pNtkTemp = Abc_NtkBalance(pNtkTemp,0,0,0);
        Abc_NtkDelete((Abc_Ntk_t *)pObj);
        Abc_NtkRewrite(pNtkTemp,0,0,0,0,0);
        Abc_NtkRefactor(pNtkTemp,10,0x10,0,0,0,0);
      }
      pMan2 = (Aig_Man_t *)Abc_NtkIvyBefore(pNtkTemp,0,0);
      local_5c = Ivy_FraigProve((Ivy_Man_t **)&pMan2,pNtk);
      pObj = (Abc_Obj_t *)pNtkTemp;
      pNtkTemp = Abc_NtkIvyAfter(pNtkTemp,(Ivy_Man_t *)pMan2,0,0);
      Abc_NtkDelete((Abc_Ntk_t *)pObj);
      pNtkTemp->pModel = *(int **)&pMan2->nBufReplaces;
      pMan2->nBufReplaces = 0;
      pMan2->nBufFixes = 0;
      Ivy_ManStop((Ivy_Man_t *)pMan2);
      if ((int)local_5c < 0) {
        pAVar7 = Abc_NtkToDar(pNtkTemp,0,0);
        if (*(int *)((long)&pNtk->pName + 4) != 0) {
          sprintf(local_c8,"cecmiter.aig");
          Ioa_WriteAiger(pAVar7,local_c8,0,0);
          printf("Intermediate reduced miter is written into file \"%s\".\n",local_c8);
        }
        local_5c = Fra_FraigSat(pAVar7,(long)*(int *)((long)&pNtk->vPos + 4),0,0,0,0,0,0,0,
                                *(int *)((long)&pNtk->pName + 4));
        pNtkTemp->pModel = (int *)pAVar7->pData;
        pAVar7->pData = (void *)0x0;
        Aig_ManStop(pAVar7);
      }
      if (((int)local_5c < 0) && (*(int *)&pNtk->pName != 0)) {
        if (*(int *)((long)&pNtk->pName + 4) != 0) {
          printf("Attempting BDDs with node limit %d ...\n",(ulong)*(uint *)((long)&pNtk->vPis + 4))
          ;
          fflush(_stdout);
        }
        pObj = (Abc_Obj_t *)pNtkTemp;
        pNtkTemp = Abc_NtkCollapse(pNtkTemp,*(int *)((long)&pNtk->vPis + 4),0,*(int *)&pNtk->vPos,0,
                                   0,0);
        if (pNtkTemp == (Abc_Ntk_t *)0x0) {
          pNtkTemp = (Abc_Ntk_t *)pObj;
        }
        else {
          Abc_NtkDelete((Abc_Ntk_t *)pObj);
          iVar2 = Abc_NtkNodeNum(pNtkTemp);
          local_cd = false;
          if (iVar2 == 1) {
            pAVar5 = Abc_NtkPo(pNtkTemp,0);
            pAVar5 = Abc_ObjFanin0(pAVar5);
            pDVar1 = (DdNode *)(pAVar5->field_5).pData;
            pDVar8 = Cudd_ReadLogicZero((DdManager *)pNtkTemp->pManFunc);
            local_cd = pDVar1 == pDVar8;
          }
          local_5c = (uint)local_cd;
        }
      }
      *(Abc_Ntk_t **)pPars_local = pNtkTemp;
      ppNtk_local._4_4_ = local_5c;
    }
  }
  else {
    iVar2 = Abc_NtkCiNum(pNtkTemp);
    piVar6 = (int *)calloc((long)iVar2,4);
    pNtkTemp->pModel = piVar6;
    ppNtk_local._4_4_ = 0;
  }
  return ppNtk_local._4_4_;
}

Assistant:

int Abc_NtkIvyProve( Abc_Ntk_t ** ppNtk, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Abc_Ntk_t * pNtk = *ppNtk, * pNtkTemp;
    Abc_Obj_t * pObj, * pFanin;
    Ivy_Man_t * pMan;
    Aig_Man_t * pMan2;
    int RetValue;
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    // experiment with various parameters settings
//    pParams->fUseBdds = 1;
//    pParams->fBddReorder = 1;
//    pParams->nTotalBacktrackLimit = 10000;
 
    // strash the network if it is not strashed already
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash( pNtkTemp = pNtk, 0, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
    }
 
    // check the case when the 0000 simulation pattern detect the bug
    pObj = Abc_NtkPo(pNtk,0);
    pFanin = Abc_ObjFanin0(pObj);
    if ( Abc_ObjFanin0(pObj)->fPhase != (unsigned)Abc_ObjFaninC0(pObj) )
    {
        pNtk->pModel = ABC_CALLOC( int, Abc_NtkCiNum(pNtk) );
        return 0;
    }

    // changed in "src\sat\fraig\fraigMan.c"
    //    pParams->nMiteringLimitStart  = 300;    // starting mitering limit
    // to be
    //    pParams->nMiteringLimitStart  = 5000;    // starting mitering limit

    // if SAT only, solve without iteration
//    RetValue = Abc_NtkMiterSat( pNtk, 2*(ABC_INT64_T)pParams->nMiteringLimitStart, (ABC_INT64_T)0, 0, NULL, NULL );
    pMan2 = Abc_NtkToDar( pNtk, 0, 0 );
    RetValue = Fra_FraigSat( pMan2, (ABC_INT64_T)pParams->nMiteringLimitStart, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 ); 
    pNtk->pModel = (int *)pMan2->pData, pMan2->pData = NULL;
    Aig_ManStop( pMan2 );
//    pNtk->pModel = Aig_ManReleaseData( pMan2 );
    if ( RetValue >= 0 )
        return RetValue;

    // apply AIG rewriting
    if ( pParams->fUseRewriting && Abc_NtkNodeNum(pNtk) > 500 )
    {
//        abctime clk = Abc_Clock();
//printf( "Before rwsat = %d. ", Abc_NtkNodeNum(pNtk) );
        pParams->fUseRewriting = 0;
        pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
        Abc_NtkDelete( pNtkTemp );
        Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
        pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
        Abc_NtkDelete( pNtkTemp );
        Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
        Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
//printf( "After rwsat = %d. ", Abc_NtkNodeNum(pNtk) );
//ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // convert ABC network into IVY network
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );

    // solve the CEC problem
    RetValue = Ivy_FraigProve( &pMan, pParams );
//    RetValue = -1;

    // convert IVY network into ABC network    
    pNtk = Abc_NtkIvyAfter( pNtkTemp = pNtk, pMan, 0, 0 );
    Abc_NtkDelete( pNtkTemp );
    // transfer model if given
    pNtk->pModel = (int *)pMan->pData; pMan->pData = NULL;
    Ivy_ManStop( pMan );

    // try to prove it using brute force SAT with good CNF encoding
    if ( RetValue < 0 )
    {
        pMan2 = Abc_NtkToDar( pNtk, 0, 0 );
        // dump the miter before entering high-effort solving
        if ( pParams->fVerbose )
        {
            char pFileName[100];
            sprintf( pFileName, "cecmiter.aig" );
            Ioa_WriteAiger( pMan2, pFileName, 0, 0 );
            printf( "Intermediate reduced miter is written into file \"%s\".\n", pFileName );
        }
        RetValue = Fra_FraigSat( pMan2, pParams->nMiteringLimitLast, 0, 0, 0, 0, 0, 0, 0, pParams->fVerbose ); 
        pNtk->pModel = (int *)pMan2->pData, pMan2->pData = NULL;
        Aig_ManStop( pMan2 );
    }

    // try to prove it using brute force BDDs
#ifdef ABC_USE_CUDD
    if ( RetValue < 0 && pParams->fUseBdds )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting BDDs with node limit %d ...\n", pParams->nBddSizeLimit );
            fflush( stdout );
        }
        pNtk = Abc_NtkCollapse( pNtkTemp = pNtk, pParams->nBddSizeLimit, 0, pParams->fBddReorder, 0, 0, 0 );
        if ( pNtk )   
        {
            Abc_NtkDelete( pNtkTemp );
            RetValue = ( (Abc_NtkNodeNum(pNtk) == 1) && (Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pData == Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc)) );
        }
        else 
            pNtk = pNtkTemp;
    }
#endif

    // return the result
    *ppNtk = pNtk;
    return RetValue;
}